

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketConnection.cpp
# Opt level: O3

int __thiscall
FIX::ThreadedSocketConnection::connect
          (ThreadedSocketConnection *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  
  if ((this->m_sourceAddress)._M_string_length != 0 || this->m_sourcePort != 0) {
    socket_bind(this->m_socket,(this->m_sourceAddress)._M_dataplus._M_p,this->m_sourcePort);
  }
  iVar1 = socket_connect(this->m_socket,(this->m_address)._M_dataplus._M_p,this->m_port);
  return CONCAT31((int3)((uint)iVar1 >> 8),-1 < iVar1);
}

Assistant:

bool ThreadedSocketConnection::connect() {
  // do the bind in the thread as name resolution may block
  if (!m_sourceAddress.empty() || m_sourcePort) {
    socket_bind(m_socket, m_sourceAddress.c_str(), m_sourcePort);
  }

  return socket_connect(getSocket(), m_address.c_str(), m_port) >= 0;
}